

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O1

int __thiscall
CVmObject::getp_is_transient
          (CVmObject *this,vm_obj_id_t self,vm_val_t *retval,uint *argc,vm_prop_id_t param_4,
          vm_obj_id_t *param_5)

{
  int iVar1;
  vm_datatype_t vVar2;
  
  if (getp_is_transient(unsigned_int,vm_val_t*,unsigned_int*,unsigned_short,unsigned_int*)::desc ==
      '\0') {
    getp_is_transient();
  }
  iVar1 = get_prop_check_argc(retval,argc,&getp_is_transient::desc);
  if (iVar1 == 0) {
    if (self == 0) {
      vVar2 = VM_NIL;
    }
    else {
      vVar2 = VM_TRUE - ((G_obj_table_X.pages_[self >> 0xc][self & 0xfff].field_0x14 & 0x80) == 0);
    }
    retval->typ = vVar2;
  }
  return 1;
}

Assistant:

int CVmObject::getp_is_transient(VMG_ vm_obj_id_t self,
                                 vm_val_t *retval, uint *argc,
                                 vm_prop_id_t, vm_obj_id_t *)
{
    static CVmNativeCodeDesc desc(0);

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* indicate whether or not we're transient */
    retval->set_logical(G_obj_table->is_obj_transient(self));

    /* handled */
    return TRUE;
}